

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_MBCSLoad(UConverterSharedData *sharedData,UConverterLoadArgs *pArgs,uint8_t *raw,
                  UErrorCode *pErrorCode)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  int iVar4;
  int32_t *piVar5;
  uint16_t *puVar6;
  UConverterStaticData *pUVar7;
  byte bVar8;
  byte bVar9;
  uint8_t uVar10;
  UConverterSharedData *sharedData_00;
  uint16_t *puVar11;
  int32_t (*__dest) [256];
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint32_t asciiRoundtrips;
  uint uVar15;
  uint16_t *puVar16;
  uint uVar17;
  UConverterMBCSTable *pUVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  void *in_stack_ffffffffffffff08;
  UConverterMBCSTable *pUVar23;
  UDataInfo info;
  int8_t stateProps [128];
  
  if (*raw == '\x04') {
    uVar13 = 0x20;
    bVar22 = true;
  }
  else {
    if (((*raw != '\x05') || (raw[1] < 3)) ||
       (uVar15 = *(uint *)(raw + 0x20), (uVar15 & 0xff80) != 0)) goto LAB_002b51f3;
    bVar22 = (uVar15 & 0x40) == 0;
    uVar13 = (ulong)((uVar15 & 0x3f) << 2);
  }
  uVar15 = *(uint *)(raw + 0x18);
  bVar9 = (byte)uVar15;
  (sharedData->mbcs).outputType = bVar9;
  if (!(bool)(bVar9 != 0 | bVar22)) {
LAB_002b51f3:
    *pErrorCode = U_INVALID_TABLE_FORMAT;
    return;
  }
  if (0xff < uVar15) {
    (sharedData->mbcs).extIndexes = (int32_t *)(raw + (uVar15 >> 8));
  }
  if (0xe < bVar9) goto LAB_002b51f3;
  pUVar18 = &sharedData->mbcs;
  if ((0x130fU >> (uVar15 & 0x1f) & 1) != 0) {
    if (pArgs->onlyTestIsLoadable != '\0') {
      return;
    }
    uVar15 = *(uint *)(raw + 4);
    (sharedData->mbcs).countStates = (uint8_t)uVar15;
    (sharedData->mbcs).countToUFallbacks = *(uint32_t *)(raw + 8);
    (sharedData->mbcs).stateTable = (int32_t (*) [256])(raw + uVar13);
    (sharedData->mbcs).toUFallbacks =
         (_MBCSToUFallback *)((int32_t (*) [256])(raw + uVar13) + uVar15);
    (sharedData->mbcs).unicodeCodeUnits = (uint16_t *)(raw + *(uint *)(raw + 0xc));
    (sharedData->mbcs).fromUnicodeTable = (uint16_t *)(raw + *(uint *)(raw + 0x10));
    (sharedData->mbcs).fromUnicodeBytes = raw + *(uint *)(raw + 0x14);
    (sharedData->mbcs).fromUBytesLength = *(uint32_t *)(raw + 0x1c);
    info.size = 0x14;
    udata_getInfo_63((UDataMemory *)sharedData->dataMemory,&info);
    if ((info.formatVersion[0] < 7) &&
       ((info.formatVersion[0] != '\x06' || (info.formatVersion[1] == '\0')))) {
      (sharedData->mbcs).unicodeMask = '\x03';
      bVar9 = 3;
    }
    else {
      bVar9 = sharedData->staticData->unicodeMask & 3;
      (sharedData->mbcs).unicodeMask = bVar9;
      if ((2 < raw[1]) && (bVar9 < 2)) {
        if (pUVar18->countStates == '\x01') {
          if (0xe < raw[2]) {
            (sharedData->mbcs).utf8Friendly = '\x01';
            puVar11 = (sharedData->mbcs).fromUnicodeTable;
            uVar15 = 0;
            for (uVar13 = 0; uVar13 != 0x40; uVar13 = uVar13 + 1) {
              (sharedData->mbcs).sbcsIndex[uVar13] =
                   puVar11[(ulong)(uVar15 & 0x3c) + (ulong)puVar11[uVar13 >> 4 & 0xfffffff]];
              uVar15 = uVar15 + 4;
            }
            (sharedData->mbcs).maxFastUChar = L'࿿';
          }
        }
        else if (0xd6 < raw[2]) {
          (sharedData->mbcs).utf8Friendly = '\x01';
          if (bVar22) {
            uVar13 = (ulong)(sharedData->mbcs).fromUBytesLength;
          }
          else {
            uVar13 = 0;
          }
          (sharedData->mbcs).mbcsIndex = (uint16_t *)((sharedData->mbcs).fromUnicodeBytes + uVar13);
          (sharedData->mbcs).maxFastUChar = (ushort)raw[2] << 8 | 0xff;
        }
      }
    }
    uVar15 = 0xffffffff;
    for (uVar13 = 0; uVar13 != 0x80; uVar13 = uVar13 + 1) {
      bVar8 = (byte)((uVar13 & 0xffffffff) >> 2) & 0x1f;
      uVar19 = -2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8;
      if (uVar13 + 0x80000000 == (ulong)(uint)(*(sharedData->mbcs).stateTable)[uVar13]) {
        uVar19 = 0xffffffff;
      }
      uVar15 = uVar15 & uVar19;
    }
    (sharedData->mbcs).asciiRoundtrips = uVar15;
    if (!bVar22) {
      iVar12 = *(int *)(raw + 0x10);
      iVar4 = *(int *)(raw + 0x14);
      uVar19 = *(uint *)(raw + 0x24);
      uVar15 = (bVar9 & 1) * 0x800 + 0x80;
      uVar13 = (ulong)(uVar15 + uVar19 * 4 + (sharedData->mbcs).fromUBytesLength);
      puVar11 = (uint16_t *)uprv_malloc_63(uVar13);
      (sharedData->mbcs).reconstitutedData = (uint8_t *)puVar11;
      if (puVar11 == (uint16_t *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uVar17 = (bVar9 & 1) << 10 | 0x40;
        uVar21 = uVar17 >> 1;
        iVar12 = ((uint)(iVar4 - iVar12) >> 2) - uVar21;
        lVar20 = 0;
        memset(puVar11,0,uVar13);
        puVar16 = (sharedData->mbcs).fromUnicodeTable;
        memcpy(puVar11,puVar16,(ulong)uVar15);
        uVar13 = (ulong)(uVar17 * 2);
        memcpy((uint8_t *)((long)puVar11 + (ulong)(uVar19 - iVar12) * 4 + uVar13),
               (void *)((long)puVar16 + uVar13),(ulong)(uint)(iVar12 * 4));
        (sharedData->mbcs).fromUnicodeTable = puVar11;
        (sharedData->mbcs).fromUnicodeBytes =
             (uint8_t *)((long)puVar11 + (ulong)uVar19 * 4 + uVar13);
        UVar2 = (sharedData->mbcs).maxFastUChar;
        for (iVar12 = 0; iVar12 < (int)((ushort)UVar2 + 1 >> 6); iVar12 = iVar12 + 0x10) {
          if (uVar21 != puVar11[lVar20]) {
            puVar6 = (sharedData->mbcs).mbcsIndex;
            puVar16 = puVar11 + (ulong)puVar11[lVar20] * 2 + 6;
            for (lVar14 = (long)iVar12; iVar12 + 0x10 != lVar14; lVar14 = lVar14 + 1) {
              uVar3 = puVar6[lVar14];
              if (uVar3 != 0) {
                uVar15 = (uint)(uVar3 >> 4);
                *(uint *)(puVar16 + -6) = uVar15;
                *(uint *)(puVar16 + -4) = uVar15 + 1;
                *(uint *)(puVar16 + -2) = uVar15 + 2;
                *(uint *)puVar16 = uVar15 + 3;
              }
              puVar16 = puVar16 + 8;
            }
          }
          lVar20 = lVar20 + 1;
        }
        stateProps[0x70] = -1;
        stateProps[0x71] = -1;
        stateProps[0x72] = -1;
        stateProps[0x73] = -1;
        stateProps[0x74] = -1;
        stateProps[0x75] = -1;
        stateProps[0x76] = -1;
        stateProps[0x77] = -1;
        stateProps[0x78] = -1;
        stateProps[0x79] = -1;
        stateProps[0x7a] = -1;
        stateProps[0x7b] = -1;
        stateProps[0x7c] = -1;
        stateProps[0x7d] = -1;
        stateProps[0x7e] = -1;
        stateProps[0x7f] = -1;
        stateProps[0x60] = -1;
        stateProps[0x61] = -1;
        stateProps[0x62] = -1;
        stateProps[99] = -1;
        stateProps[100] = -1;
        stateProps[0x65] = -1;
        stateProps[0x66] = -1;
        stateProps[0x67] = -1;
        stateProps[0x68] = -1;
        stateProps[0x69] = -1;
        stateProps[0x6a] = -1;
        stateProps[0x6b] = -1;
        stateProps[0x6c] = -1;
        stateProps[0x6d] = -1;
        stateProps[0x6e] = -1;
        stateProps[0x6f] = -1;
        stateProps[0x50] = -1;
        stateProps[0x51] = -1;
        stateProps[0x52] = -1;
        stateProps[0x53] = -1;
        stateProps[0x54] = -1;
        stateProps[0x55] = -1;
        stateProps[0x56] = -1;
        stateProps[0x57] = -1;
        stateProps[0x58] = -1;
        stateProps[0x59] = -1;
        stateProps[0x5a] = -1;
        stateProps[0x5b] = -1;
        stateProps[0x5c] = -1;
        stateProps[0x5d] = -1;
        stateProps[0x5e] = -1;
        stateProps[0x5f] = -1;
        stateProps[0x40] = -1;
        stateProps[0x41] = -1;
        stateProps[0x42] = -1;
        stateProps[0x43] = -1;
        stateProps[0x44] = -1;
        stateProps[0x45] = -1;
        stateProps[0x46] = -1;
        stateProps[0x47] = -1;
        stateProps[0x48] = -1;
        stateProps[0x49] = -1;
        stateProps[0x4a] = -1;
        stateProps[0x4b] = -1;
        stateProps[0x4c] = -1;
        stateProps[0x4d] = -1;
        stateProps[0x4e] = -1;
        stateProps[0x4f] = -1;
        stateProps[0x30] = -1;
        stateProps[0x31] = -1;
        stateProps[0x32] = -1;
        stateProps[0x33] = -1;
        stateProps[0x34] = -1;
        stateProps[0x35] = -1;
        stateProps[0x36] = -1;
        stateProps[0x37] = -1;
        stateProps[0x38] = -1;
        stateProps[0x39] = -1;
        stateProps[0x3a] = -1;
        stateProps[0x3b] = -1;
        stateProps[0x3c] = -1;
        stateProps[0x3d] = -1;
        stateProps[0x3e] = -1;
        stateProps[0x3f] = -1;
        stateProps[0x20] = -1;
        stateProps[0x21] = -1;
        stateProps[0x22] = -1;
        stateProps[0x23] = -1;
        stateProps[0x24] = -1;
        stateProps[0x25] = -1;
        stateProps[0x26] = -1;
        stateProps[0x27] = -1;
        stateProps[0x28] = -1;
        stateProps[0x29] = -1;
        stateProps[0x2a] = -1;
        stateProps[0x2b] = -1;
        stateProps[0x2c] = -1;
        stateProps[0x2d] = -1;
        stateProps[0x2e] = -1;
        stateProps[0x2f] = -1;
        stateProps[0x10] = -1;
        stateProps[0x11] = -1;
        stateProps[0x12] = -1;
        stateProps[0x13] = -1;
        stateProps[0x14] = -1;
        stateProps[0x15] = -1;
        stateProps[0x16] = -1;
        stateProps[0x17] = -1;
        stateProps[0x18] = -1;
        stateProps[0x19] = -1;
        stateProps[0x1a] = -1;
        stateProps[0x1b] = -1;
        stateProps[0x1c] = -1;
        stateProps[0x1d] = -1;
        stateProps[0x1e] = -1;
        stateProps[0x1f] = -1;
        stateProps[0] = -1;
        stateProps[1] = -1;
        stateProps[2] = -1;
        stateProps[3] = -1;
        stateProps[4] = -1;
        stateProps[5] = -1;
        stateProps[6] = -1;
        stateProps[7] = -1;
        stateProps[8] = -1;
        stateProps[9] = -1;
        stateProps[10] = -1;
        stateProps[0xb] = -1;
        stateProps[0xc] = -1;
        stateProps[0xd] = -1;
        stateProps[0xe] = -1;
        stateProps[0xf] = -1;
        pUVar23 = pUVar18;
        getStateProp((sharedData->mbcs).stateTable,stateProps,0);
        for (uVar13 = 0; uVar13 < pUVar18->countStates; uVar13 = uVar13 + 1) {
          if ('?' < stateProps[uVar13]) {
            enumToU(pUVar18,stateProps,(int32_t)uVar13,0,0,(UConverterEnumToUCallback *)pUVar18,
                    in_stack_ffffffffffffff08,(UErrorCode *)pUVar23);
          }
        }
      }
    }
    goto LAB_002b548a;
  }
  if ((uVar15 & 0xff) != 0xe) goto LAB_002b51f3;
  stateProps[0x18] = '\0';
  stateProps[0x19] = '\0';
  stateProps[0x1a] = '\0';
  stateProps[0x1b] = '\0';
  stateProps[0x1c] = '\0';
  stateProps[0x1d] = '\0';
  stateProps[0x1e] = '\0';
  stateProps[0x1f] = '\0';
  stateProps[0x20] = '\0';
  stateProps[0x21] = '\0';
  stateProps[0x22] = '\0';
  stateProps[0x23] = '\0';
  stateProps[0x24] = '\0';
  stateProps[0x25] = '\0';
  stateProps[0x26] = '\0';
  stateProps[0x27] = '\0';
  stateProps[8] = '\0';
  stateProps[9] = '\0';
  stateProps[10] = '\0';
  stateProps[0xb] = '\0';
  stateProps[0xc] = '\0';
  stateProps[0xd] = '\0';
  stateProps[0xe] = '\0';
  stateProps[0xf] = '\0';
  stateProps[0x10] = '\0';
  stateProps[0x11] = '\0';
  stateProps[0x12] = '\0';
  stateProps[0x13] = '\0';
  stateProps[0x14] = '\0';
  stateProps[0x15] = '\0';
  stateProps[0x16] = '\0';
  stateProps[0x17] = '\0';
  piVar5 = (sharedData->mbcs).extIndexes;
  if (piVar5 == (int32_t *)0x0) goto LAB_002b51f3;
  if (pArgs->nestedLoads != 1) {
    *pErrorCode = U_INVALID_TABLE_FILE;
    return;
  }
  iVar12 = strcmp((char *)(raw + uVar13),sharedData->staticData->name);
  if (iVar12 == 0) goto LAB_002b51f3;
  stateProps[0] = '(';
  stateProps[1] = '\0';
  stateProps[2] = '\0';
  stateProps[3] = '\0';
  stateProps[4] = '\x02';
  stateProps[5] = '\0';
  stateProps[6] = '\0';
  stateProps[7] = '\0';
  stateProps[8] = pArgs->onlyTestIsLoadable;
  stateProps._10_2_ = pArgs->reserved;
  stateProps._12_4_ = pArgs->options;
  stateProps._16_8_ = pArgs->pkg;
  stateProps._24_8_ = raw + uVar13;
  sharedData_00 = ucnv_load_63((UConverterLoadArgs *)stateProps,pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if ((sharedData_00->staticData->conversionType != '\x02') ||
     ((sharedData_00->mbcs).baseSharedData != (UConverterSharedData *)0x0)) {
    ucnv_unload_63(sharedData_00);
    goto LAB_002b51f3;
  }
  if (pArgs->onlyTestIsLoadable != '\0') {
    ucnv_unload_63(sharedData_00);
    return;
  }
  pUVar23 = pUVar18;
  memcpy(pUVar18,&sharedData_00->mbcs,0xd8);
  (sharedData->mbcs).baseSharedData = sharedData_00;
  (sharedData->mbcs).extIndexes = piVar5;
  (sharedData->mbcs).swapLFNLStateTable = (int32_t (*) [256])0x0;
  (sharedData->mbcs).swapLFNLFromUnicodeBytes = (uint8_t *)0x0;
  (sharedData->mbcs).reconstitutedData = (uint8_t *)0x0;
  (sharedData->mbcs).swapLFNLName = (char *)0x0;
  cVar1 = sharedData->staticData->conversionType;
  if ((cVar1 == '\x01') || ((cVar1 == '\x02' && ('\x01' < sharedData->staticData->minBytesPerChar)))
     ) {
    pUVar18 = pUVar23;
    if ((sharedData_00->mbcs).outputType == '\f') {
      uVar15 = (*(sharedData->mbcs).stateTable)[0xe];
      if (((uVar15 & 0x80f00000) == 0x80800000) && (uVar15 = uVar15 >> 0x18 & 0x7f, uVar15 != 0)) {
        (sharedData->mbcs).dbcsOnlyState = (uint8_t)uVar15;
LAB_002b558f:
        (sharedData->mbcs).outputType = 0xdb;
      }
    }
    else {
      pUVar7 = sharedData_00->staticData;
      if ((((pUVar7->conversionType == '\x02') && (pUVar7->minBytesPerChar == '\x01')) &&
          (pUVar7->maxBytesPerChar == '\x02')) && (bVar9 = pUVar23->countStates, -1 < (char)bVar9))
      {
        __dest = (int32_t (*) [256])uprv_malloc_63((ulong)((bVar9 + 1) * 0x400));
        if (__dest == (int32_t (*) [256])0x0) {
          ucnv_unload_63(sharedData_00);
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          return;
        }
        memcpy(__dest,(sharedData->mbcs).stateTable,(ulong)bVar9 << 10);
        for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 1) {
          if ((*__dest)[lVar20] < 0) {
            (*__dest)[lVar20] = (uint)bVar9 << 0x18;
          }
        }
        for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 1) {
          __dest[bVar9][lVar20] = -0x7f900000;
        }
        (sharedData->mbcs).stateTable = __dest;
        (sharedData->mbcs).countStates = (uint8_t)(bVar9 + 1);
        (sharedData->mbcs).stateTableOwned = '\x01';
        pUVar18 = pUVar23;
        goto LAB_002b558f;
      }
    }
  }
LAB_002b548a:
  if ((sharedData->mbcs).utf8Friendly != '\0') {
    if (pUVar18->countStates != '\x01') {
      uVar10 = (sharedData->mbcs).outputType;
      if (uVar10 == '\x01') {
        sharedData->impl = &_DBCSUTF8Impl;
        return;
      }
      goto LAB_002b54ab;
    }
    sharedData->impl = &_SBCSUTF8Impl;
  }
  uVar10 = (sharedData->mbcs).outputType;
LAB_002b54ab:
  if ((uVar10 != 0xdb) && (uVar10 != '\f')) {
    return;
  }
  (sharedData->mbcs).asciiRoundtrips = 0;
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSLoad(UConverterSharedData *sharedData,
          UConverterLoadArgs *pArgs,
          const uint8_t *raw,
          UErrorCode *pErrorCode) {
    UDataInfo info;
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;
    _MBCSHeader *header=(_MBCSHeader *)raw;
    uint32_t offset;
    uint32_t headerLength;
    UBool noFromU=FALSE;

    if(header->version[0]==4) {
        headerLength=MBCS_HEADER_V4_LENGTH;
    } else if(header->version[0]==5 && header->version[1]>=3 &&
              (header->options&MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0) {
        headerLength=header->options&MBCS_OPT_LENGTH_MASK;
        noFromU=(UBool)((header->options&MBCS_OPT_NO_FROM_U)!=0);
    } else {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    mbcsTable->outputType=(uint8_t)header->flags;
    if(noFromU && mbcsTable->outputType==MBCS_OUTPUT_1) {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    /* extension data, header version 4.2 and higher */
    offset=header->flags>>8;
    if(offset!=0) {
        mbcsTable->extIndexes=(const int32_t *)(raw+offset);
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_EXT_ONLY) {
        UConverterLoadArgs args=UCNV_LOAD_ARGS_INITIALIZER;
        UConverterSharedData *baseSharedData;
        const int32_t *extIndexes;
        const char *baseName;

        /* extension-only file, load the base table and set values appropriately */
        if((extIndexes=mbcsTable->extIndexes)==NULL) {
            /* extension-only file without extension */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        if(pArgs->nestedLoads!=1) {
            /* an extension table must not be loaded as a base table */
            *pErrorCode=U_INVALID_TABLE_FILE;
            return;
        }

        /* load the base table */
        baseName=(const char *)header+headerLength*4;
        if(0==uprv_strcmp(baseName, sharedData->staticData->name)) {
            /* forbid loading this same extension-only file */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        /* TODO parse package name out of the prefix of the base name in the extension .cnv file? */
        args.size=sizeof(UConverterLoadArgs);
        args.nestedLoads=2;
        args.onlyTestIsLoadable=pArgs->onlyTestIsLoadable;
        args.reserved=pArgs->reserved;
        args.options=pArgs->options;
        args.pkg=pArgs->pkg;
        args.name=baseName;
        baseSharedData=ucnv_load(&args, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
        if( baseSharedData->staticData->conversionType!=UCNV_MBCS ||
            baseSharedData->mbcs.baseSharedData!=NULL
        ) {
            ucnv_unload(baseSharedData);
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            ucnv_unload(baseSharedData);
            return;
        }

        /* copy the base table data */
        uprv_memcpy(mbcsTable, &baseSharedData->mbcs, sizeof(UConverterMBCSTable));

        /* overwrite values with relevant ones for the extension converter */
        mbcsTable->baseSharedData=baseSharedData;
        mbcsTable->extIndexes=extIndexes;

        /*
         * It would be possible to share the swapLFNL data with a base converter,
         * but the generated name would have to be different, and the memory
         * would have to be free'd only once.
         * It is easier to just create the data for the extension converter
         * separately when it is requested.
         */
        mbcsTable->swapLFNLStateTable=NULL;
        mbcsTable->swapLFNLFromUnicodeBytes=NULL;
        mbcsTable->swapLFNLName=NULL;

        /*
         * The reconstitutedData must be deleted only when the base converter
         * is unloaded.
         */
        mbcsTable->reconstitutedData=NULL;

        /*
         * Set a special, runtime-only outputType if the extension converter
         * is a DBCS version of a base converter that also maps single bytes.
         */
        if( sharedData->staticData->conversionType==UCNV_DBCS ||
                (sharedData->staticData->conversionType==UCNV_MBCS &&
                 sharedData->staticData->minBytesPerChar>=2)
        ) {
            if(baseSharedData->mbcs.outputType==MBCS_OUTPUT_2_SISO) {
                /* the base converter is SI/SO-stateful */
                int32_t entry;

                /* get the dbcs state from the state table entry for SO=0x0e */
                entry=mbcsTable->stateTable[0][0xe];
                if( MBCS_ENTRY_IS_FINAL(entry) &&
                    MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_CHANGE_ONLY &&
                    MBCS_ENTRY_FINAL_STATE(entry)!=0
                ) {
                    mbcsTable->dbcsOnlyState=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry);

                    mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
                }
            } else if(
                baseSharedData->staticData->conversionType==UCNV_MBCS &&
                baseSharedData->staticData->minBytesPerChar==1 &&
                baseSharedData->staticData->maxBytesPerChar==2 &&
                mbcsTable->countStates<=127
            ) {
                /* non-stateful base converter, need to modify the state table */
                int32_t (*newStateTable)[256];
                int32_t *state;
                int32_t i, count;

                /* allocate a new state table and copy the base state table contents */
                count=mbcsTable->countStates;
                newStateTable=(int32_t (*)[256])uprv_malloc((count+1)*1024);
                if(newStateTable==NULL) {
                    ucnv_unload(baseSharedData);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return;
                }

                uprv_memcpy(newStateTable, mbcsTable->stateTable, count*1024);

                /* change all final single-byte entries to go to a new all-illegal state */
                state=newStateTable[0];
                for(i=0; i<256; ++i) {
                    if(MBCS_ENTRY_IS_FINAL(state[i])) {
                        state[i]=MBCS_ENTRY_TRANSITION(count, 0);
                    }
                }

                /* build the new all-illegal state */
                state=newStateTable[count];
                for(i=0; i<256; ++i) {
                    state[i]=MBCS_ENTRY_FINAL(0, MBCS_STATE_ILLEGAL, 0);
                }
                mbcsTable->stateTable=(const int32_t (*)[256])newStateTable;
                mbcsTable->countStates=(uint8_t)(count+1);
                mbcsTable->stateTableOwned=TRUE;

                mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
            }
        }

        /*
         * unlike below for files with base tables, do not get the unicodeMask
         * from the sharedData; instead, use the base table's unicodeMask,
         * which we copied in the memcpy above;
         * this is necessary because the static data unicodeMask, especially
         * the UCNV_HAS_SUPPLEMENTARY flag, is part of the base table data
         */
    } else {
        /* conversion file with a base table; an additional extension table is optional */
        /* make sure that the output type is known */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
            /* OK */
            break;
        default:
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            return;
        }

        mbcsTable->countStates=(uint8_t)header->countStates;
        mbcsTable->countToUFallbacks=header->countToUFallbacks;
        mbcsTable->stateTable=(const int32_t (*)[256])(raw+headerLength*4);
        mbcsTable->toUFallbacks=(const _MBCSToUFallback *)(mbcsTable->stateTable+header->countStates);
        mbcsTable->unicodeCodeUnits=(const uint16_t *)(raw+header->offsetToUCodeUnits);

        mbcsTable->fromUnicodeTable=(const uint16_t *)(raw+header->offsetFromUTable);
        mbcsTable->fromUnicodeBytes=(const uint8_t *)(raw+header->offsetFromUBytes);
        mbcsTable->fromUBytesLength=header->fromUBytesLength;

        /*
         * converter versions 6.1 and up contain a unicodeMask that is
         * used here to select the most efficient function implementations
         */
        info.size=sizeof(UDataInfo);
        udata_getInfo((UDataMemory *)sharedData->dataMemory, &info);
        if(info.formatVersion[0]>6 || (info.formatVersion[0]==6 && info.formatVersion[1]>=1)) {
            /* mask off possible future extensions to be safe */
            mbcsTable->unicodeMask=(uint8_t)(sharedData->staticData->unicodeMask&3);
        } else {
            /* for older versions, assume worst case: contains anything possible (prevent over-optimizations) */
            mbcsTable->unicodeMask=UCNV_HAS_SUPPLEMENTARY|UCNV_HAS_SURROGATES;
        }

        /*
         * _MBCSHeader.version 4.3 adds utf8Friendly data structures.
         * Check for the header version, SBCS vs. MBCS, and for whether the
         * data structures are optimized for code points as high as what the
         * runtime code is designed for.
         * The implementation does not handle mapping tables with entries for
         * unpaired surrogates.
         */
        if( header->version[1]>=3 &&
            (mbcsTable->unicodeMask&UCNV_HAS_SURROGATES)==0 &&
            (mbcsTable->countStates==1 ?
                (header->version[2]>=(SBCS_FAST_MAX>>8)) :
                (header->version[2]>=(MBCS_FAST_MAX>>8))
            )
        ) {
            mbcsTable->utf8Friendly=TRUE;

            if(mbcsTable->countStates==1) {
                /*
                 * SBCS: Stage 3 is allocated in 64-entry blocks for U+0000..SBCS_FAST_MAX or higher.
                 * Build a table with indexes to each block, to be used instead of
                 * the regular stage 1/2 table.
                 */
                int32_t i;
                for(i=0; i<(SBCS_FAST_LIMIT>>6); ++i) {
                    mbcsTable->sbcsIndex[i]=mbcsTable->fromUnicodeTable[mbcsTable->fromUnicodeTable[i>>4]+((i<<2)&0x3c)];
                }
                /* set SBCS_FAST_MAX to reflect the reach of sbcsIndex[] even if header->version[2]>(SBCS_FAST_MAX>>8) */
                mbcsTable->maxFastUChar=SBCS_FAST_MAX;
            } else {
                /*
                 * MBCS: Stage 3 is allocated in 64-entry blocks for U+0000..MBCS_FAST_MAX or higher.
                 * The .cnv file is prebuilt with an additional stage table with indexes
                 * to each block.
                 */
                mbcsTable->mbcsIndex=(const uint16_t *)
                    (mbcsTable->fromUnicodeBytes+
                     (noFromU ? 0 : mbcsTable->fromUBytesLength));
                mbcsTable->maxFastUChar=(((UChar)header->version[2])<<8)|0xff;
            }
        }

        /* calculate a bit set of 4 ASCII characters per bit that round-trip to ASCII bytes */
        {
            uint32_t asciiRoundtrips=0xffffffff;
            int32_t i;

            for(i=0; i<0x80; ++i) {
                if(mbcsTable->stateTable[0][i]!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, i)) {
                    asciiRoundtrips&=~((uint32_t)1<<(i>>2));
                }
            }
            mbcsTable->asciiRoundtrips=asciiRoundtrips;
        }

        if(noFromU) {
            uint32_t stage1Length=
                mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY ?
                    0x440 : 0x40;
            uint32_t stage2Length=
                (header->offsetFromUBytes-header->offsetFromUTable)/4-
                stage1Length/2;
            reconstituteData(mbcsTable, stage1Length, stage2Length, header->fullStage2Length, pErrorCode);
        }
    }

    /* Set the impl pointer here so that it is set for both extension-only and base tables. */
    if(mbcsTable->utf8Friendly) {
        if(mbcsTable->countStates==1) {
            sharedData->impl=&_SBCSUTF8Impl;
        } else {
            if(mbcsTable->outputType==MBCS_OUTPUT_2) {
                sharedData->impl=&_DBCSUTF8Impl;
            }
        }
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_DBCS_ONLY || mbcsTable->outputType==MBCS_OUTPUT_2_SISO) {
        /*
         * MBCS_OUTPUT_DBCS_ONLY: No SBCS mappings, therefore ASCII does not roundtrip.
         * MBCS_OUTPUT_2_SISO: Bypass the ASCII fastpath to handle prevLength correctly.
         */
        mbcsTable->asciiRoundtrips=0;
    }
}